

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CoreMLModels::Gazetteer::MergePartialFromCodedStream
          (Gazetteer *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int byte_limit;
  uint32 uVar7;
  StringVector *this_02;
  pair<int,_int> pVar8;
  int64 iVar9;
  char cVar10;
  ulong uVar11;
  string *psVar12;
  
  this_00 = &this->modelparameterdata_;
  this_01 = &this->language_;
LAB_002a6817:
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_002a6a2a;
        uVar11 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_002a6a2a:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    uVar7 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_002a6874;
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (99 < uVar6) {
      if (uVar6 == 100) {
        if (cVar10 != '\"') goto LAB_002a6874;
        psVar12 = this_00->ptr_;
        if (psVar12 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar12 = this_00->ptr_;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar12);
      }
      else {
        if ((uVar6 != 200) || (cVar10 != 'B')) goto LAB_002a6874;
        if (this->_oneof_case_[0] == 200) {
          this_02 = (this->ClassLabels_).stringclasslabels_;
        }
        else {
          this->_oneof_case_[0] = 200;
          this_02 = (StringVector *)operator_new(0x30);
          StringVector::StringVector(this_02);
          (this->ClassLabels_).stringclasslabels_ = this_02;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4))
        {
          input->buffer_ = puVar4 + 1;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (byte_limit < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,byte_limit);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar5 = StringVector::MergePartialFromCodedStream(this_02,input);
        if (!bVar5) {
          return false;
        }
        bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar8.first);
      }
LAB_002a6895:
      if (bVar5 == false) {
        return false;
      }
      goto LAB_002a6817;
    }
    if (uVar6 == 1) {
      if (cVar10 != '\b') {
LAB_002a6874:
        if (uVar7 == 0) {
          return true;
        }
        if ((uVar7 & 7) == 4) {
          return true;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
        goto LAB_002a6895;
      }
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar7 = (uint32)bVar2;
        if (-1 < (char)bVar2) {
          this->revision_ = (uint)bVar2;
          input->buffer_ = pbVar3 + 1;
          goto LAB_002a6817;
        }
      }
      else {
        uVar7 = 0;
      }
      iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
      this->revision_ = (uint32)iVar9;
      if (iVar9 < 0) {
        return false;
      }
      goto LAB_002a6817;
    }
    if ((uVar6 != 10) || (cVar10 != 'R')) goto LAB_002a6874;
    psVar12 = this_01->ptr_;
    if (psVar12 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (this_01,(string *)
                         &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      psVar12 = this_01->ptr_;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar12);
    if (!bVar5) {
      return false;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,PARSE,
                       "CoreML.Specification.CoreMLModels.Gazetteer.language");
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool Gazetteer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.Gazetteer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.Gazetteer.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.Gazetteer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.Gazetteer)
  return false;
#undef DO_
}